

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O1

int reduce_pp_expression(Context_conflict1 *ctx)

{
  IncludeState *s;
  bool bVar1;
  int iVar2;
  Token TVar3;
  Token TVar4;
  Token TVar5;
  uint uVar6;
  Define *pDVar7;
  undefined8 uVar8;
  bool bVar9;
  long lVar10;
  char *pcVar11;
  bool bVar12;
  Token *pTVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  Token stack [64];
  RpnTokens output [128];
  Token local_948 [2];
  IncludeState *local_940;
  ulong local_938 [127];
  Token aTStack_53c [65];
  Token local_438 [258];
  
  local_940 = ctx->include_stack;
  TVar3 = TOKEN_UNKNOWN;
  uVar17 = 0;
  uVar15 = 0;
  local_948[1] = 0;
  do {
    s = ctx->include_stack;
    if (s->pushedback == 0) {
      TVar5 = preprocessor_lexer(s);
    }
    else {
      s->pushedback = 0;
      TVar5 = s->tokenval;
    }
    bVar9 = false;
    if ((int)TVar5 < 0x2d) {
      if (TVar5 != 0x21) {
        if (TVar5 == 0x2b) {
          bVar9 = TVar3 == 0x29 || TVar3 == TOKEN_INT_LITERAL;
          TVar5 = 0x2b;
          if ((TVar3 != 0x29) && (TVar3 != TOKEN_INT_LITERAL)) {
            TVar5 = TOKEN_PP_UNARY_PLUS;
          }
        }
        else {
LAB_0014cc86:
          bVar9 = true;
        }
      }
    }
    else if (TVar5 != 0x7e) {
      if (TVar5 != 0x2d) goto LAB_0014cc86;
      bVar9 = TVar3 == 0x29 || TVar3 == TOKEN_INT_LITERAL;
      TVar5 = 0x2d;
      if ((TVar3 != 0x29) && (TVar3 != TOKEN_INT_LITERAL)) {
        TVar5 = TOKEN_PP_UNARY_MINUS;
      }
    }
    if (TVar5 == TOKEN_IDENTIFIER) {
      iVar2 = handle_pp_identifier(ctx);
      bVar12 = false;
      if (iVar2 == 0) {
        if ((s->tokenlen == 7) &&
           (*(int *)((long)s->token + 3) == 0x64656e69 && *(int *)s->token == 0x69666564)) {
          if (s->pushedback == 0) {
            TVar5 = preprocessor_lexer(s);
          }
          else {
            s->pushedback = 0;
            TVar5 = s->tokenval;
          }
          TVar4 = TVar5;
          if (TVar5 == 0x28) {
            if (s->pushedback == 0) {
              local_948[0] = TVar5;
              TVar4 = preprocessor_lexer(s);
              TVar5 = local_948[0];
            }
            else {
              s->pushedback = 0;
              TVar4 = s->tokenval;
            }
          }
          if (TVar4 == TOKEN_IDENTIFIER) {
            local_948[0] = TVar5;
            pDVar7 = find_define_by_token(ctx);
            if (local_948[0] == 0x28) {
              if (s->pushedback == 0) {
                TVar5 = preprocessor_lexer(s);
              }
              else {
                s->pushedback = 0;
                TVar5 = s->tokenval;
              }
              if (TVar5 != 0x29) {
LAB_0014d002:
                pcVar11 = "Unmatched \')\'";
                goto LAB_0014d015;
              }
            }
            if (0x7f < uVar17) {
              __assert_fail("outputsize < STATICARRAYLEN(output)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                            ,0x6d9,"int reduce_pp_expression(Context *)");
            }
            local_438[uVar17 * 2] = 0;
            local_438[uVar17 * 2 + 1] = (uint)(pDVar7 != (Define *)0x0);
            uVar17 = uVar17 + 1;
          }
          else {
            pcVar11 = "operator \'defined\' requires an identifier";
LAB_0014d015:
            failf(ctx,"%s",pcVar11);
            bVar12 = true;
          }
        }
        else {
          if (0x7f < uVar17) {
            __assert_fail("outputsize < STATICARRAYLEN(output)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                          ,0x6df,"int reduce_pp_expression(Context *)");
          }
          (local_438 + uVar17 * 2)[0] = 0;
          (local_438 + uVar17 * 2)[1] = 0;
          uVar17 = uVar17 + 1;
          TVar3 = TOKEN_INT_LITERAL;
LAB_0014ced4:
          bVar12 = false;
        }
      }
    }
    else {
      ctx->recursion_count = 0;
      bVar12 = false;
      if ((int)TVar5 < 0x29) {
        if (TVar5 == 10) {
          local_948[1] = 1;
          TVar3 = TVar5;
        }
        else {
          if (TVar5 != 0x28) goto LAB_0014ce0e;
          if (0x3f < uVar15) {
            __assert_fail("stacksize < STATICARRAYLEN(stack)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                          ,0x6e7,"int reduce_pp_expression(Context *)");
          }
          aTStack_53c[uVar15 + 1] = 0x28;
          uVar15 = uVar15 + 1;
          TVar3 = 0x28;
          bVar12 = false;
        }
      }
      else if (TVar5 == TOKEN_EOI) {
        if (s == local_940) {
          local_948[1] = 1;
          TVar3 = TOKEN_EOI;
          bVar12 = false;
        }
        else {
          pop_source(ctx);
          bVar12 = false;
        }
      }
      else if (TVar5 == TOKEN_INT_LITERAL) {
        if (0x7f < uVar17) {
          __assert_fail("outputsize < STATICARRAYLEN(output)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                        ,0x6e3,"int reduce_pp_expression(Context *)");
        }
        local_438[uVar17 * 2] = 0;
        TVar3 = token_to_int(s);
        local_438[uVar17 * 2 + 1] = TVar3;
        uVar17 = uVar17 + 1;
        TVar3 = TOKEN_INT_LITERAL;
      }
      else {
        if (TVar5 == 0x29) {
          bVar9 = false;
          uVar16 = uVar15;
          do {
            uVar15 = uVar16 - 1;
            if (uVar16 == 0) {
              uVar15 = 0;
              break;
            }
            TVar5 = aTStack_53c[uVar16];
            if (TVar5 == 0x28) {
              bVar9 = true;
            }
            else {
              if (0x7f < uVar17) {
                __assert_fail("outputsize < STATICARRAYLEN(output)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                              ,0x6f4,"int reduce_pp_expression(Context *)");
              }
              local_438[uVar17 * 2] = 1;
              local_438[uVar17 * 2 + 1] = TVar5;
              uVar17 = uVar17 + 1;
            }
            uVar16 = uVar15;
          } while (TVar5 != 0x28);
          if (!bVar9) goto LAB_0014d002;
          TVar3 = 0x29;
          goto LAB_0014ced4;
        }
LAB_0014ce0e:
        lVar10 = 0;
        do {
          if (*(Token *)(find_precedence_ops + lVar10 * 8 + 4) == TVar5) {
            iVar2 = *(int *)(find_precedence_ops + lVar10 * 8);
            goto LAB_0014ce2b;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x16);
        iVar2 = -1;
LAB_0014ce2b:
        if (iVar2 < 0) {
          if (s->pushedback != 0) {
            __assert_fail("!state->pushedback",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                          ,0x2d5,"void pushback(IncludeState *)");
          }
          s->pushedback = 1;
          pcVar11 = "Invalid expression";
          goto LAB_0014d015;
        }
        do {
          if (uVar15 == 0) {
            uVar15 = 0;
            break;
          }
          TVar3 = aTStack_53c[uVar15];
          lVar10 = 0;
          do {
            if (*(Token *)(find_precedence_ops + lVar10 * 8 + 4) == TVar3) {
              iVar14 = *(int *)(find_precedence_ops + lVar10 * 8);
              goto LAB_0014ce68;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0x16);
          iVar14 = -1;
LAB_0014ce68:
          if (iVar14 < 0) {
LAB_0014ceb6:
            bVar1 = false;
          }
          else {
            bVar1 = iVar2 < iVar14;
            if (bVar9) {
              bVar1 = iVar2 <= iVar14;
            }
            if (!bVar1) goto LAB_0014ceb6;
            if (0x7f < uVar17) {
              __assert_fail("outputsize < STATICARRAYLEN(output)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                            ,0x713,"int reduce_pp_expression(Context *)");
            }
            local_438[uVar17 * 2] = 1;
            local_438[uVar17 * 2 + 1] = TVar3;
            uVar17 = uVar17 + 1;
            bVar1 = true;
            uVar15 = uVar15 - 1;
          }
        } while (bVar1);
        if (0x3f < uVar15) {
          __assert_fail("stacksize < STATICARRAYLEN(stack)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                        ,0x71a,"int reduce_pp_expression(Context *)");
        }
        aTStack_53c[uVar15 + 1] = TVar5;
        uVar15 = uVar15 + 1;
        TVar3 = TVar5;
      }
    }
    if (bVar12) {
      return -1;
    }
  } while (local_948[1] == 0);
  while (uVar15 != 0) {
    TVar3 = aTStack_53c[uVar15];
    if (TVar3 == 0x28) {
      failf(ctx,"%s","Unmatched \')\'");
    }
    else {
      if (0x7f < uVar17) {
        __assert_fail("outputsize < STATICARRAYLEN(output)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                      ,0x729,"int reduce_pp_expression(Context *)");
      }
      local_438[uVar17 * 2] = 1;
      local_438[uVar17 * 2 + 1] = TVar3;
      uVar17 = uVar17 + 1;
    }
    uVar15 = uVar15 - 1;
    if (TVar3 == 0x28) {
      return -1;
    }
  }
  if ((int)uVar17 < 1) {
LAB_0014d3cf:
    bVar9 = false;
    uVar6 = 0;
    goto switchD_0014d0ea_caseD_22;
  }
  iVar2 = (int)uVar17 + 1;
  pTVar13 = local_438 + 1;
  uVar15 = 0;
LAB_0014d0bd:
  if (pTVar13[-1] == 0) {
    if (0x7f < uVar15) {
      __assert_fail("stacksize < STATICARRAYLEN(stack)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                    ,0x648,"long interpret_rpn(const RpnTokens *, int, int *)");
    }
    local_938[uVar15] = (long)(int)*pTVar13;
    uVar15 = uVar15 + 1;
    goto LAB_0014d3a7;
  }
  TVar3 = *pTVar13;
  uVar6 = 0;
  bVar9 = false;
  if ((int)TVar3 < 0x7e) {
    if ((int)TVar3 < 0x3c) {
      uVar6 = 0;
      bVar9 = false;
      switch(TVar3) {
      case 0x21:
        if (uVar15 != 0) {
          local_938[uVar15 - 1] = (ulong)(local_938[uVar15 - 1] == 0);
          goto LAB_0014d3a7;
        }
        goto LAB_0014d3cf;
      default:
        goto switchD_0014d0ea_caseD_22;
      case 0x25:
        if (1 < uVar15) {
          *(long *)(local_948 + uVar15 * 2) =
               (long)*(undefined8 *)(local_948 + uVar15 * 2) % (long)local_938[uVar15 - 1];
          break;
        }
        goto LAB_0014d3cf;
      case 0x26:
        if (uVar15 < 2) goto LAB_0014d3cf;
        *(ulong *)(local_948 + uVar15 * 2) =
             *(undefined8 *)(local_948 + uVar15 * 2) & local_938[uVar15 - 1];
        break;
      case 0x2a:
        if (1 < uVar15) {
          uVar8 = local_938[uVar15 - 1] * *(undefined8 *)(local_948 + uVar15 * 2);
          goto LAB_0014d231;
        }
        goto LAB_0014d3cf;
      case 0x2b:
        if (uVar15 < 2) goto LAB_0014d3cf;
        *(ulong *)(local_948 + uVar15 * 2) =
             *(undefined8 *)(local_948 + uVar15 * 2) + local_938[uVar15 - 1];
        break;
      case 0x2d:
        if (uVar15 < 2) goto LAB_0014d3cf;
        *(ulong *)(local_948 + uVar15 * 2) =
             *(undefined8 *)(local_948 + uVar15 * 2) - local_938[uVar15 - 1];
        break;
      case 0x2f:
        if (uVar15 < 2) goto LAB_0014d3cf;
        uVar8 = (long)*(undefined8 *)(local_948 + uVar15 * 2) / (long)local_938[uVar15 - 1];
LAB_0014d231:
        *(undefined8 *)(local_948 + uVar15 * 2) = uVar8;
      }
    }
    else {
      if ((int)TVar3 < 0x5e) {
        if (TVar3 != 0x3c) {
          uVar6 = 0;
          bVar9 = false;
          if (TVar3 == 0x3e) {
            if (1 < uVar15) {
              uVar8 = ZEXT18((long)local_938[uVar15 - 1] <
                             (long)*(undefined8 *)(local_948 + uVar15 * 2));
              goto LAB_0014d39f;
            }
            goto LAB_0014d3cf;
          }
          goto switchD_0014d0ea_caseD_22;
        }
        if (uVar15 < 2) goto LAB_0014d3cf;
        uVar8 = ZEXT18((long)*(undefined8 *)(local_948 + uVar15 * 2) < (long)local_938[uVar15 - 1]);
        goto LAB_0014d39f;
      }
      if (TVar3 != 0x5e) {
        if (TVar3 == 0x7c) {
          if (1 < uVar15) {
            *(ulong *)(local_948 + uVar15 * 2) =
                 *(undefined8 *)(local_948 + uVar15 * 2) | local_938[uVar15 - 1];
            goto LAB_0014d3a4;
          }
          goto LAB_0014d3cf;
        }
        goto switchD_0014d0ea_caseD_22;
      }
      if (uVar15 < 2) goto LAB_0014d3cf;
      *(ulong *)(local_948 + uVar15 * 2) =
           *(undefined8 *)(local_948 + uVar15 * 2) ^ local_938[uVar15 - 1];
    }
  }
  else {
    if (300 < (int)TVar3) {
      if (TVar3 == TOKEN_PP_UNARY_MINUS) {
        if (uVar15 != 0) {
          local_938[uVar15 - 1] = -local_938[uVar15 - 1];
          goto LAB_0014d3a7;
        }
        goto LAB_0014d3cf;
      }
      if (TVar3 != TOKEN_PP_UNARY_PLUS) goto switchD_0014d0ea_caseD_22;
      if (uVar15 == 0) goto LAB_0014d3cf;
      goto LAB_0014d3a7;
    }
    switch(TVar3) {
    case TOKEN_RSHIFT:
      if (1 < uVar15) {
        *(long *)(local_948 + uVar15 * 2) =
             (long)*(undefined8 *)(local_948 + uVar15 * 2) >> ((byte)local_938[uVar15 - 1] & 0x3f);
        goto LAB_0014d3a4;
      }
      goto LAB_0014d3cf;
    case TOKEN_LSHIFT:
      if (1 < uVar15) {
        *(undefined8 *)(local_948 + uVar15 * 2) =
             *(undefined8 *)(local_948 + uVar15 * 2) << ((byte)local_938[uVar15 - 1] & 0x3f);
        goto LAB_0014d3a4;
      }
      goto LAB_0014d3cf;
    case TOKEN_ANDAND:
      if (1 < uVar15) {
        if (*(undefined8 *)(local_948 + uVar15 * 2) == 0) {
          uVar8 = 0;
        }
        else {
LAB_0014d2f1:
          uVar8 = ZEXT18(local_938[uVar15 - 1] != 0);
        }
        goto LAB_0014d2fc;
      }
      goto LAB_0014d3cf;
    case TOKEN_OROR:
      if (1 < uVar15) {
        uVar8 = 1;
        if (*(undefined8 *)(local_948 + uVar15 * 2) == 0) goto LAB_0014d2f1;
LAB_0014d2fc:
        *(undefined8 *)(local_948 + uVar15 * 2) = uVar8;
        uVar15 = uVar15 - 1;
        goto LAB_0014d3a7;
      }
      goto LAB_0014d3cf;
    case TOKEN_LEQ:
      if (uVar15 < 2) goto LAB_0014d3cf;
      uVar8 = ZEXT18((long)*(undefined8 *)(local_948 + uVar15 * 2) <= (long)local_938[uVar15 - 1]);
      break;
    case TOKEN_GEQ:
      if (uVar15 < 2) goto LAB_0014d3cf;
      uVar8 = ZEXT18((long)local_938[uVar15 - 1] <= (long)*(undefined8 *)(local_948 + uVar15 * 2));
      break;
    case TOKEN_EQL:
      if (uVar15 < 2) goto LAB_0014d3cf;
      uVar8 = ZEXT18(*(undefined8 *)(local_948 + uVar15 * 2) == local_938[uVar15 - 1]);
      break;
    case TOKEN_NEQ:
      if (uVar15 < 2) goto LAB_0014d3cf;
      uVar8 = ZEXT18(*(undefined8 *)(local_948 + uVar15 * 2) != local_938[uVar15 - 1]);
      break;
    default:
      if (TVar3 == 0x7e) {
        if (uVar15 != 0) {
          local_938[uVar15 - 1] = ~local_938[uVar15 - 1];
          goto LAB_0014d3a7;
        }
        goto LAB_0014d3cf;
      }
      goto switchD_0014d0ea_caseD_22;
    }
LAB_0014d39f:
    *(undefined8 *)(local_948 + uVar15 * 2) = uVar8;
  }
LAB_0014d3a4:
  uVar15 = uVar15 - 1;
LAB_0014d3a7:
  iVar2 = iVar2 + -1;
  pTVar13 = pTVar13 + 2;
  if (iVar2 < 2) goto code_r0x0014d3b8;
  goto LAB_0014d0bd;
code_r0x0014d3b8:
  bVar9 = uVar15 == 1;
  uVar6 = (uint)(local_938[0] != 0 && bVar9);
switchD_0014d0ea_caseD_22:
  if (!bVar9) {
    failf(ctx,"%s","Invalid expression");
    return -1;
  }
  return uVar6;
}

Assistant:

static int reduce_pp_expression(Context *ctx)
{
    IncludeState *orig_state = ctx->include_stack;
    RpnTokens output[128];
    Token stack[64];
    Token previous_token = TOKEN_UNKNOWN;
    size_t outputsize = 0;
    size_t stacksize = 0;
    int matched = 0;
    int done = 0;

    #define ADD_TO_OUTPUT(op, val) \
        assert(outputsize < STATICARRAYLEN(output)); \
        output[outputsize].isoperator = op; \
        output[outputsize].value = val; \
        outputsize++;

    #define PUSH_TO_STACK(t) \
        assert(stacksize < STATICARRAYLEN(stack)); \
        stack[stacksize] = t; \
        stacksize++;

    while (!done)
    {
        IncludeState *state = ctx->include_stack;
        Token token = lexer(state);
        int isleft = 1;
        int precedence = -1;

        if ( (token == ((Token) '!')) || (token == ((Token) '~')) )
            isleft = 0;
        else if (token == ((Token) '-'))
        {
            isleft = ((previous_token == TOKEN_INT_LITERAL) ||
                      (previous_token == ((Token) ')')));
            if (!isleft)
                token = TOKEN_PP_UNARY_MINUS;
        } // else if
        else if (token == ((Token) '+'))
        {
            isleft = ((previous_token == TOKEN_INT_LITERAL) ||
                      (previous_token == ((Token) ')')));
            if (!isleft)
                token = TOKEN_PP_UNARY_PLUS;
        } // else if

        if (token != TOKEN_IDENTIFIER)
            ctx->recursion_count = 0;

        switch (token)
        {
            case TOKEN_EOI:
                if (state != orig_state)  // end of a substate, or the expr?
                {
                    pop_source(ctx);
                    continue;  // substate, go again with the parent state.
                } // if
                done = 1;  // the expression itself is done.
                break;

            case ((Token) '\n'):
                done = 1;
                break;  // we're done!

            case TOKEN_IDENTIFIER:
                if (handle_pp_identifier(ctx))
                    continue;  // go again with new IncludeState.

                if ( (state->tokenlen == 7) &&
                     (memcmp(state->token, "defined", 7) == 0) )
                {
                    token = lexer(state);
                    const int paren = (token == ((Token) '('));
                    if (paren)  // gcc doesn't let us nest parens here, either.
                        token = lexer(state);
                    if (token != TOKEN_IDENTIFIER)
                    {
                        fail(ctx, "operator 'defined' requires an identifier");
                        return -1;
                    } // if
                    const int found = (find_define_by_token(ctx) != NULL);

                    if (paren)
                    {
                        if (lexer(state) != ((Token) ')'))
                        {
                            fail(ctx, "Unmatched ')'");
                            return -1;
                        } // if
                    } // if

                    ADD_TO_OUTPUT(0, found);
                    continue;
                } // if

                // can't replace identifier with a number? It becomes zero.
                token = TOKEN_INT_LITERAL;
                ADD_TO_OUTPUT(0, 0);
                break;

            case TOKEN_INT_LITERAL:
                ADD_TO_OUTPUT(0, token_to_int(state));
                break;

            case ((Token) '('):
                PUSH_TO_STACK((Token) '(');
                break;

            case ((Token) ')'):
                matched = 0;
                while (stacksize > 0)
                {
                    const Token t = stack[--stacksize];
                    if (t == ((Token) '('))
                    {
                        matched = 1;
                        break;
                    } // if
                    ADD_TO_OUTPUT(1, t);
                } // while

                if (!matched)
                {
                    fail(ctx, "Unmatched ')'");
                    return -1;
                } // if
                break;

            default:
                precedence = find_precedence(token);
                // bogus token, or two operators together.
                if (precedence < 0)
                {
                    pushback(state);
                    fail(ctx, "Invalid expression");
                    return -1;
                } // if

                else  // it's an operator.
                {
                    while (stacksize > 0)
                    {
                        const Token t = stack[stacksize-1];
                        const int p = find_precedence(t);
                        if ( (p >= 0) &&
                             ( ((isleft) && (precedence <= p)) ||
                               ((!isleft) && (precedence < p)) ) )
                        {
                            stacksize--;
                            ADD_TO_OUTPUT(1, t);
                        } // if
                        else
                        {
                            break;
                        } // else
                    } // while
                    PUSH_TO_STACK(token);
                } // else
                break;
        } // switch
        previous_token = token;
    } // while

    while (stacksize > 0)
    {
        const Token t = stack[--stacksize];
        if (t == ((Token) '('))
        {
            fail(ctx, "Unmatched ')'");
            return -1;
        } // if
        ADD_TO_OUTPUT(1, t);
    } // while

    #undef ADD_TO_OUTPUT
    #undef PUSH_TO_STACK

    // okay, you now have some validated data in reverse polish notation.
    #if DEBUG_PREPROCESSOR
    printf("PREPROCESSOR EXPRESSION RPN:");
    int i = 0;
    for (i = 0; i < outputsize; i++)
    {
        if (!output[i].isoperator)
            printf(" %d", output[i].value);
        else
        {
            switch (output[i].value)
            {
                case TOKEN_OROR: printf(" ||"); break;
                case TOKEN_ANDAND: printf(" &&"); break;
                case TOKEN_NEQ: printf(" !="); break;
                case TOKEN_EQL: printf(" =="); break;
                case TOKEN_LEQ: printf(" <="); break;
                case TOKEN_GEQ: printf(" >="); break;
                case TOKEN_LSHIFT: printf(" <<"); break;
                case TOKEN_RSHIFT: printf(" >>"); break;
                case TOKEN_PP_UNARY_PLUS: printf(" +"); break;
                case TOKEN_PP_UNARY_MINUS: printf(" -"); break;
                default: printf(" %c", output[i].value); break;
            } // switch
        } // else
    } // for
    printf("\n");
    #endif

    int error = 0;
    const long val = interpret_rpn(output, outputsize, &error);

    #if DEBUG_PREPROCESSOR
    printf("PREPROCESSOR RPN RESULT: %ld%s\n", val, error ? " (ERROR)" : "");
    #endif

    if (error)
    {
        fail(ctx, "Invalid expression");
        return -1;
    } // if

    return ((val) ? 1 : 0);
}